

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  uint *puVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [32];
  char **ppcVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  ThreadPool *this;
  FILE *__s;
  runtime_error *this_00;
  long lVar16;
  undefined8 uVar17;
  Gamut gamut;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  pointer __p;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  int res;
  float *out;
  float *scale;
  uint local_94;
  int local_90;
  uint local_8c;
  void *local_88;
  void *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  char **local_58;
  long *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  if (argc < 3) {
    pcVar20 = 
    "Syntax: rgb2spec_opt <resolution> <output> [<gamut>]\nwhere <gamut> is one of sRGB,eRGB,XYZ,ProPhotoRGB,ACES2065_1,REC2020"
    ;
    goto LAB_00104ba2;
  }
  gamut = SRGB;
  if (argc != 3) {
    pcVar20 = argv[3];
    iVar13 = strcasecmp(pcVar20,"sRGB");
    if (iVar13 != 0) {
      iVar13 = strcasecmp(pcVar20,"eRGB");
      if (iVar13 == 0) {
LAB_00104751:
        gamut = ERGB;
      }
      else {
        iVar13 = strcasecmp(pcVar20,"XYZ");
        if (iVar13 == 0) {
          gamut = XYZ;
        }
        else {
          iVar13 = strcasecmp(pcVar20,"ProPhotoRGB");
          if (iVar13 == 0) {
            gamut = ProPhotoRGB;
          }
          else {
            iVar13 = strcasecmp(pcVar20,"ACES2065_1");
            if (iVar13 == 0) {
              gamut = ACES2065_1;
            }
            else {
              iVar13 = strcasecmp(pcVar20,"REC2020");
              if (iVar13 == 0) {
                gamut = REC2020;
              }
              else {
                iVar13 = strcasecmp(pcVar20,"DCI_P3");
                gamut = DCI_P3;
                if (iVar13 != 0) {
                  main_cold_1();
                  goto LAB_00104751;
                }
              }
            }
          }
        }
      }
    }
  }
  init_tables(gamut);
  uVar14 = atoi(argv[1]);
  if (uVar14 != 0) {
    local_94 = uVar14;
    iVar15 = std::thread::hardware_concurrency();
    iVar13 = 1;
    if (1 < iVar15) {
      iVar13 = iVar15;
    }
    uVar17 = extraout_XMM0_Qb;
    this = (ThreadPool *)operator_new(0x80);
    ThreadPool::ThreadPool(this,iVar13);
    local_78._M_unused._M_object = (long **)0x0;
    std::__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>::reset
              ((__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_> *)&threadPool,this);
    std::unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_>::~unique_ptr
              ((unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_> *)&local_78);
    local_58 = argv;
    printf("Optimizing %s spectra...\n",argv[3]);
    fflush(_stdout);
    uVar19 = (long)(int)uVar14 << 2;
    if ((int)uVar14 < 0) {
      uVar19 = 0xffffffffffffffff;
    }
    local_80 = operator_new__(uVar19);
    if (0 < (int)uVar14) {
      auVar22 = vbroadcastsd_avx512f(ZEXT816(0x4008000000000000));
      auVar23 = vbroadcastsd_avx512f(ZEXT816(0xc000000000000000));
      auVar11 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar25 = vpbroadcastq_avx512f(ZEXT816(8));
      auVar31._8_4_ = 8;
      auVar31._0_8_ = 0x800000008;
      auVar31._12_4_ = 8;
      auVar31._16_4_ = 8;
      auVar31._20_4_ = 8;
      auVar31._24_4_ = 8;
      auVar31._28_4_ = 8;
      auVar30._0_8_ = (double)(int)(uVar14 - 1);
      auVar30._8_8_ = uVar17;
      auVar26 = vpbroadcastq_avx512f();
      lVar16 = 0;
      auVar27 = vbroadcastsd_avx512f(auVar30);
      do {
        auVar28 = vcvtudq2pd_avx512f(auVar11);
        uVar19 = vpcmpuq_avx512f(auVar24,auVar26,2);
        auVar24 = vpaddq_avx512f(auVar24,auVar25);
        auVar11 = vpaddd_avx2(auVar11,auVar31);
        auVar28 = vdivpd_avx512f(auVar28,auVar27);
        auVar29 = vmulpd_avx512f(auVar28,auVar28);
        auVar28 = vfmadd213pd_avx512f(auVar28,auVar23,auVar22);
        auVar28 = vmulpd_avx512f(auVar29,auVar28);
        auVar29 = vmulpd_avx512f(auVar28,auVar28);
        auVar28 = vfmadd213pd_avx512f(auVar28,auVar23,auVar22);
        auVar28 = vmulpd_avx512f(auVar29,auVar28);
        auVar21 = vcvtpd2ps_avx512f(auVar28);
        puVar2 = (uint *)((long)local_80 + lVar16);
        bVar3 = (bool)((byte)uVar19 & 1);
        bVar4 = (bool)((byte)(uVar19 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar19 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar19 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar19 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar19 >> 6) & 1);
        bVar10 = SUB81(uVar19 >> 7,0);
        *puVar2 = (uint)bVar3 * auVar21._0_4_ | (uint)!bVar3 * *puVar2;
        puVar2[1] = (uint)bVar4 * auVar21._4_4_ | (uint)!bVar4 * puVar2[1];
        puVar2[2] = (uint)bVar5 * auVar21._8_4_ | (uint)!bVar5 * puVar2[2];
        puVar2[3] = (uint)bVar6 * auVar21._12_4_ | (uint)!bVar6 * puVar2[3];
        puVar2[4] = (uint)bVar7 * auVar21._16_4_ | (uint)!bVar7 * puVar2[4];
        puVar2[5] = (uint)bVar8 * auVar21._20_4_ | (uint)!bVar8 * puVar2[5];
        puVar2[6] = (uint)bVar9 * auVar21._24_4_ | (uint)!bVar9 * puVar2[6];
        puVar2[7] = (uint)bVar10 * auVar21._28_4_ | (uint)!bVar10 * puVar2[7];
        lVar16 = lVar16 + 0x20;
      } while ((ulong)(uVar14 + 7 >> 3) << 5 != lVar16);
    }
    local_8c = uVar14 * uVar14 * uVar14 * 9;
    uVar19 = (long)(int)local_8c * 4;
    if ((int)local_8c < 0) {
      uVar19 = 0xffffffffffffffff;
    }
    local_88 = operator_new__(uVar19);
    local_90 = 0;
    do {
      lVar16 = (long)(int)local_94;
      local_48 = 0;
      local_50 = (long *)operator_new(0x20);
      local_78._8_8_ = 0;
      local_60 = std::
                 _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/rgb2spec_opt.cpp:604:9)>
                 ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/rgb2spec_opt.cpp:604:9)>
                 ::_M_manager;
      *local_50 = (long)&local_94;
      local_50[1] = (long)&local_80;
      local_50[2] = (long)&local_90;
      local_38 = std::
                 _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/rgb2spec_opt.cpp:827:29)>
                 ::_M_invoke;
      local_50[3] = (long)&local_88;
      local_40 = std::
                 _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/rgb2spec_opt.cpp:827:29)>
                 ::_M_manager;
      local_78._M_unused._M_object = &local_50;
      ParallelFor(0,lVar16,(function<void_(long,_long)> *)&local_78,(char *)&local_88);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,3);
      }
      ppcVar12 = local_58;
      iVar13 = local_90 + 1;
      bVar3 = local_90 < 2;
      local_90 = iVar13;
    } while (bVar3);
    __s = fopen(local_58[2],"w");
    if (__s != (FILE *)0x0) {
      fwrite("#include <pbrt/pbrt.h>\n",0x17,1,__s);
      fwrite("namespace pbrt {\n",0x11,1,__s);
      fprintf(__s,"extern PBRT_CONST int %sToSpectrumTable_Res = %d;\n",ppcVar12[3],(ulong)local_94)
      ;
      fprintf(__s,"extern PBRT_CONST float %sToSpectrumTable_Scale[%d] = {\n",ppcVar12[3],
              (ulong)local_94);
      if (0 < (int)local_94) {
        lVar16 = 0;
        do {
          fprintf(__s,"%.9g, ",(double)*(float *)((long)local_80 + lVar16 * 4));
          lVar16 = lVar16 + 1;
        } while (lVar16 < (int)local_94);
      }
      fwrite("};\n",3,1,__s);
      uVar14 = local_8c;
      fprintf(__s,"extern PBRT_CONST float %sToSpectrumTable_Data[%d] = {\n",ppcVar12[3],
              (ulong)local_8c);
      uVar18 = 1;
      uVar19 = 0;
      do {
        uVar1 = uVar19 + 1;
        uVar17 = 0x20;
        if ((int)(uVar18 / 9) * 9 + 7 == (int)uVar19) {
          uVar17 = 10;
        }
        fprintf(__s,"%.9g,%c",(double)*(float *)((long)local_88 + uVar19 * 4),uVar17);
        uVar18 = (ulong)((int)uVar18 + 1);
        uVar19 = uVar1;
      } while (uVar14 != uVar1);
      fwrite("};\n",3,1,__s);
      fwrite("} // namespace pbrt\n",0x14,1,__s);
      fclose(__s);
      std::__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>::reset
                ((__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_> *)&threadPool,
                 (pointer)0x0);
      return 0;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Could not create file!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar20 = "Invalid resolution!";
  local_94 = 0;
LAB_00104ba2:
  puts(pcVar20);
  exit(-1);
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 3) {
        printf("Syntax: rgb2spec_opt <resolution> <output> [<gamut>]\n"
               "where <gamut> is one of "
               "sRGB,eRGB,XYZ,ProPhotoRGB,ACES2065_1,REC2020\n");
        exit(-1);
    }
    Gamut gamut = SRGB;
    if (argc > 3)
        gamut = parse_gamut(argv[3]);
    if (gamut == NO_GAMUT) {
        fprintf(stderr, "Could not parse gamut `%s'!\n", argv[3]);
        exit(-1);
    }
    init_tables(gamut);

    const int res = atoi(argv[1]);
    if (res == 0) {
        printf("Invalid resolution!\n");
        exit(-1);
    }

    int nThreads = AvailableCores();
    threadPool = std::make_unique<ThreadPool>(nThreads);

    printf("Optimizing %s spectra...\n", argv[3]);
    fflush(stdout);

    float *scale = new float[res];
    for (int k = 0; k < res; ++k)
        scale[k] = (float)smoothstep(smoothstep(k / double(res - 1)));

    size_t bufsize = 3 * 3 * res * res * res;
    float *out = new float[bufsize];

    for (int l = 0; l < 3; ++l) {
        ParallelFor(0, res, [&](size_t j) {
            const double y = j / double(res - 1);
            fflush(stdout);
            for (int i = 0; i < res; ++i) {
                const double x = i / double(res - 1);
                double coeffs[3], rgb[3];
                memset(coeffs, 0, sizeof(double) * 3);

                int start = res / 5;

                for (int k = start; k < res; ++k) {
                    double b = (double)scale[k];

                    rgb[l] = b;
                    rgb[(l + 1) % 3] = x * b;
                    rgb[(l + 2) % 3] = y * b;

                    double resid = gauss_newton(rgb, coeffs);
                    (void)resid;

                    double c0 = 360.0, c1 = 1.0 / (830.0 - 360.0);
                    double A = coeffs[0], B = coeffs[1], C = coeffs[2];

                    int idx = ((l * res + k) * res + j) * res + i;

                    out[3 * idx + 0] = float(A * (sqr(c1)));
                    out[3 * idx + 1] = float(B * c1 - 2 * A * c0 * (sqr(c1)));
                    out[3 * idx + 2] = float(C - B * c0 * c1 + A * (sqr(c0 * c1)));
                    // out[3*idx + 2] = resid;
                }

                memset(coeffs, 0, sizeof(double) * 3);
                for (int k = start; k >= 0; --k) {
                    double b = (double)scale[k];

                    rgb[l] = b;
                    rgb[(l + 1) % 3] = x * b;
                    rgb[(l + 2) % 3] = y * b;

                    double resid = gauss_newton(rgb, coeffs);
                    (void)resid;

                    double c0 = 360.0, c1 = 1.0 / (830.0 - 360.0);
                    double A = coeffs[0], B = coeffs[1], C = coeffs[2];

                    int idx = ((l * res + k) * res + j) * res + i;

                    out[3 * idx + 0] = float(A * (sqr(c1)));
                    out[3 * idx + 1] = float(B * c1 - 2 * A * c0 * (sqr(c1)));
                    out[3 * idx + 2] = float(C - B * c0 * c1 + A * (sqr(c0 * c1)));
                    // out[3*idx + 2] = resid;
                }
            }
        });
    }

    FILE *f = fopen(argv[2], "w");
    if (f == nullptr)
        throw std::runtime_error("Could not create file!");
    fprintf(f, "#include <pbrt/pbrt.h>\n");
    fprintf(f, "namespace pbrt {\n");
    fprintf(f, "extern PBRT_CONST int %sToSpectrumTable_Res = %d;\n", argv[3], res);
    fprintf(f, "extern PBRT_CONST float %sToSpectrumTable_Scale[%d] = {\n", argv[3], res);
    for (int i = 0; i < res; ++i)
        fprintf(f, "%.9g, ", scale[i]);
    fprintf(f, "};\n");
    fprintf(f, "extern PBRT_CONST float %sToSpectrumTable_Data[%d] = {\n", argv[3],
            (int)bufsize);
    for (int i = 0; i < bufsize; ++i)
        fprintf(f, "%.9g,%c", out[i], ((i + 1) % 9) == 8 ? '\n' : ' ');
    fprintf(f, "};\n");
    fprintf(f, "} // namespace pbrt\n");
    fclose(f);

    threadPool.reset();
}